

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstracttestlogger.cpp
# Opt level: O0

bool QTestPrivate::appendCharBuffer(QTestCharBuffer *accumulator,QTestCharBuffer *more)

{
  long lVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  char *__src;
  QTestCharBuffer *in_RSI;
  QTestCharBuffer *in_RDI;
  long in_FS_OFFSET;
  char *tail;
  int newsize;
  int oldsize;
  int extra;
  anon_class_1_0_00000001 bufsize;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  QTestCharBuffer *in_stack_ffffffffffffffc0;
  char *__dest;
  bool local_a;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar3 = appendCharBuffer::anon_class_1_0_00000001::operator()
                    ((anon_class_1_0_00000001 *)in_stack_ffffffffffffffc0,
                     (QTestCharBuffer *)
                     CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
  if (iVar3 < 1) {
    local_a = true;
  }
  else {
    iVar4 = appendCharBuffer::anon_class_1_0_00000001::operator()
                      ((anon_class_1_0_00000001 *)in_stack_ffffffffffffffc0,
                       (QTestCharBuffer *)
                       CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    if (iVar4 + iVar3 + 1 < 0x200001) {
      bVar2 = QTestCharBuffer::resize(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
      if (bVar2) {
        pcVar5 = QTestCharBuffer::data(in_RDI);
        __dest = pcVar5 + iVar4;
        __src = QTestCharBuffer::constData(in_RSI);
        memcpy(__dest,__src,(long)iVar3);
        (pcVar5 + iVar4)[iVar3] = '\0';
        local_a = true;
        goto LAB_0011bee3;
      }
    }
    local_a = false;
  }
LAB_0011bee3:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_a;
  }
  __stack_chk_fail();
}

Assistant:

bool appendCharBuffer(QTestCharBuffer *accumulator, const QTestCharBuffer &more)
{
    const auto bufsize = [](const QTestCharBuffer &buf) -> int {
        const int max = buf.size();
        return max > 0 ? int(qstrnlen(buf.constData(), max)) : 0;
    };
    const int extra = bufsize(more);
    if (extra <= 0)
        return true; // Nothing to do, fatuous success

    const int oldsize = bufsize(*accumulator);
    const int newsize = oldsize + extra + 1; // 1 for final '\0'
    if (newsize > MAXSIZE || !accumulator->resize(newsize))
        return false; // too big or unable to grow

    char *tail = accumulator->data() + oldsize;
    memcpy(tail, more.constData(), extra);
    tail[extra] = '\0';
    return true;
}